

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrobjs.c
# Opt level: O1

FT_Error pfr_face_init(FT_Stream stream,FT_Face pfrface,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  ushort *puVar1;
  byte bVar2;
  short sVar3;
  short sVar4;
  FT_UInt32 size;
  byte *pbVar5;
  FT_String *pFVar6;
  bool bVar7;
  uint uVar8;
  FT_Stream pFVar9;
  FT_ListNode pFVar10;
  FT_UInt16 FVar11;
  FT_Bitmap_Size *pFVar12;
  FT_ULong FVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  ushort *puVar17;
  ushort uVar18;
  uint uVar19;
  ushort *puVar20;
  uint *puVar21;
  uint uVar22;
  int *piVar23;
  int iVar24;
  uint uVar25;
  FT_UInt count;
  ushort *puVar26;
  FT_Error error;
  FT_CharMapRec charmap;
  uint local_48;
  uint local_44;
  FT_CharMapRec_ local_40;
  ulong new_count;
  
  local_48 = FT_Stream_Seek(stream,0);
  if ((local_48 == 0) &&
     (local_48 = FT_Stream_ReadFields(stream,pfr_header_fields,pfrface + 1), local_48 == 0)) {
    piVar23 = (int *)((long)&pfrface[1].num_glyphs + 4);
    *piVar23 = *piVar23 + pfrface[1].num_charmaps * 0x10000;
    local_48 = 0;
  }
  if ((((local_48 == 0) && ((int)pfrface[1].num_faces == 0x50465230)) &&
      (*(uint *)((long)&pfrface[1].num_faces + 4) < 5)) &&
     ((0x39 < *(uint *)((long)&pfrface[1].face_index + 4) && ((int)pfrface[1].face_index == 0xd0a)))
     ) {
    uVar14 = (ulong)*(uint *)((long)&pfrface[1].face_flags + 4);
    local_40.face._0_4_ = FT_Stream_Seek(stream,uVar14);
    if (((uint)local_40.face == 0) &&
       (FVar11 = FT_Stream_ReadUShort(stream,(FT_Error *)&local_40), (uint)local_40.face == 0)) {
      if ((0x3332 < FVar11) ||
         ((stream->size - uVar14 <= (ulong)((uint)FVar11 + (uint)FVar11 * 4 + 2) ||
          (stream->size <= (ulong)((((uint)FVar11 + (uint)FVar11 * 2) * 8 - (uint)FVar11) + 0x5f))))
         ) {
        local_40.face._0_4_ = 8;
        goto LAB_0022d7a4;
      }
      pFVar12 = (FT_Bitmap_Size *)(ulong)(uint)FVar11;
    }
    else {
LAB_0022d7a4:
      pFVar12 = (FT_Bitmap_Size *)0x0;
    }
    local_48 = (uint)local_40.face;
    iVar15 = 6;
    if ((uint)local_40.face == 0) {
      pfrface->num_faces = (FT_Long)pFVar12;
      iVar15 = 0;
    }
    if (iVar15 != 6) {
      if (iVar15 != 0) goto LAB_0022d78d;
      if (-1 < face_index) {
        uVar25 = face_index & 0xffff;
        if ((long)(ulong)uVar25 < pfrface->num_faces) {
          iVar15 = pfrface[1].num_charmaps;
          local_40.face._0_4_ =
               FT_Stream_Seek(stream,(ulong)*(uint *)((long)&pfrface[1].face_flags + 4));
          if (((uint)local_40.face != 0) ||
             (FVar11 = FT_Stream_ReadUShort(stream,(FT_Error *)&local_40), (uint)local_40.face != 0)
             ) goto switchD_0022ddba_caseD_2;
          uVar22 = 6;
          if (uVar25 < FVar11) {
            local_40.face._0_4_ = FT_Stream_Skip(stream,(ulong)(uVar25 * 5));
            if ((((uint)local_40.face == 0) &&
                (FVar11 = FT_Stream_ReadUShort(stream,(FT_Error *)&local_40),
                (uint)local_40.face == 0)) &&
               (FVar13 = FT_Stream_ReadUOffset(stream,(FT_Error *)&local_40),
               (uint)local_40.face == 0)) {
              uVar22 = (uint)FVar11;
              *(uint *)((long)&pfrface[1].bbox.xMin + 4) = uVar22;
              *(int *)&pfrface[1].bbox.yMin = (int)FVar13;
              local_40.face._0_4_ = FT_Stream_Seek(stream,FVar13 & 0xffffffff);
              local_44 = 2;
              if ((uint)local_40.face == 0) {
                local_40.face._0_4_ = FT_Stream_EnterFrame(stream,(ulong)uVar22);
                if ((uint)local_40.face == 0) {
                  if (0xc < FVar11) {
                    pbVar5 = stream->cursor;
                    puVar26 = (ushort *)(pbVar5 + uVar22);
                    *(int *)((long)&pfrface[1].bbox.yMin + 4) =
                         (int)((uint)pbVar5[2] << 8 |
                              (uint)pbVar5[1] << 0x10 | (uint)*pbVar5 << 0x18) >> 8;
                    *(int *)&pfrface[1].bbox.xMax =
                         (int)((uint)pbVar5[5] << 8 |
                              (uint)pbVar5[4] << 0x10 | (uint)pbVar5[3] << 0x18) >> 8;
                    *(int *)((long)&pfrface[1].bbox.xMax + 4) =
                         (int)((uint)pbVar5[8] << 8 |
                              (uint)pbVar5[7] << 0x10 | (uint)pbVar5[6] << 0x18) >> 8;
                    *(int *)&pfrface[1].bbox.yMax =
                         (int)((uint)pbVar5[0xb] << 8 |
                              (uint)pbVar5[10] << 0x10 | (uint)pbVar5[9] << 0x18) >> 8;
                    puVar20 = (ushort *)(pbVar5 + 0xd);
                    bVar2 = pbVar5[0xc];
                    uVar22 = 0;
                    if ((bVar2 & 4) != 0) {
                      uVar19 = (uint)((bVar2 & 8) == 0);
                      uVar22 = uVar19 ^ 5;
                      if ((bVar2 & 3) != 0) {
                        uVar22 = 2 - uVar19;
                      }
                    }
                    if ((ushort *)
                        ((ulong)((2 - ((bVar2 & 0x20) == 0) & (int)((uint)bVar2 << 0x1b) >> 0x1f) +
                                uVar22) + (long)puVar20) <= puVar26) {
                      if ((bVar2 & 4) != 0) {
                        uVar18 = *puVar20;
                        uVar22 = (uint)(ushort)(byte)uVar18;
                        if ((bVar2 & 8) == 0) {
                          puVar20 = (ushort *)(pbVar5 + 0xe);
                        }
                        else {
                          puVar20 = (ushort *)(pbVar5 + 0xf);
                          uVar22 = (int)(short)((ushort)(byte)uVar18 << 8) | (uint)pbVar5[0xe];
                        }
                        pfrface[1].units_per_EM = (short)uVar22;
                        pfrface[1].ascender = (short)(uVar22 >> 0x10);
                        if ((bVar2 & 3) == 0) {
                          uVar18 = *puVar20;
                          pbVar5 = (byte *)((long)puVar20 + 1);
                          puVar17 = puVar20 + 1;
                          puVar20 = (ushort *)((long)puVar20 + 3);
                          iVar24 = (int)((uint)(byte)*puVar17 << 8 |
                                        (uint)*pbVar5 << 0x10 | (uint)(byte)uVar18 << 0x18) >> 8;
                          pfrface[1].max_advance_width = (short)iVar24;
                          pfrface[1].max_advance_height = (short)((uint)iVar24 >> 0x10);
                        }
                      }
                      if ((bVar2 & 0x10) != 0) {
                        uVar18 = *puVar20;
                        uVar22 = (uint)(ushort)(byte)uVar18;
                        if ((bVar2 & 0x20) == 0) {
                          puVar20 = (ushort *)((long)puVar20 + 1);
                        }
                        else {
                          pbVar5 = (byte *)((long)puVar20 + 1);
                          puVar20 = puVar20 + 1;
                          uVar22 = (int)(short)((ushort)(byte)uVar18 << 8) | (uint)*pbVar5;
                        }
                        pfrface[1].descender = (short)uVar22;
                        pfrface[1].height = (short)(uVar22 >> 0x10);
                      }
                      if ((bVar2 & 0x40) != 0) {
                        puVar17 = (ushort *)((long)puVar20 + 1);
                        local_44 = 8;
                        local_40.face._0_4_ = 0;
                        if (puVar26 < puVar17) {
LAB_0022dd51:
                          bVar7 = false;
                          local_40.face._0_4_ = 8;
                        }
                        else {
                          uVar18 = *puVar20;
                          uVar22 = (uint)(byte)uVar18;
                          bVar7 = true;
                          puVar20 = puVar17;
                          if ((byte)uVar18 != 0) {
                            local_40.face._0_4_ = 0;
                            do {
                              puVar1 = puVar17 + 1;
                              puVar20 = puVar17;
                              if ((puVar26 < puVar1) ||
                                 (puVar17 = (ushort *)((ulong)(byte)*puVar17 + (long)puVar1),
                                 puVar20 = puVar1, puVar26 < puVar17)) goto LAB_0022dd51;
                              uVar22 = uVar22 - 1;
                              puVar20 = puVar17;
                            } while (uVar22 != 0);
                          }
                        }
                        if (!bVar7) goto LAB_0022dd9d;
                      }
                      if ((ushort *)((long)puVar20 + 5U) <= puVar26) {
                        uVar18 = *puVar20 << 8 | *puVar20 >> 8;
                        pfrface[1].underline_position = (short)(uint)uVar18;
                        pfrface[1].underline_thickness = (short)((uint)uVar18 >> 0x10);
                        local_44 = 0;
                        *(uint *)&pfrface[1].glyph =
                             (uint)(byte)puVar20[2] |
                             (uint)*(byte *)((long)puVar20 + 3) << 8 |
                             (uint)(byte)puVar20[1] << 0x10;
                        if ((iVar15 != 0) && (local_44 = 5, puVar20 + 3 <= puVar26)) {
                          uVar22 = (uint)CONCAT12(*(byte *)((long)puVar20 + 5U),uVar18);
                          pfrface[1].underline_position = (short)uVar22;
                          pfrface[1].underline_thickness = (short)(uVar22 >> 0x10);
                          local_44 = 0;
                        }
                        goto LAB_0022dd9d;
                      }
                    }
                  }
                  local_44 = 5;
                }
              }
LAB_0022dd9d:
              uVar22 = local_44;
              switch(local_44) {
              default:
                goto switchD_0022ddba_caseD_1;
              case 2:
                break;
              case 5:
                local_40.face._0_4_ = 8;
              case 0:
              case 8:
                FT_Stream_ExitFrame(stream);
              }
            }
switchD_0022ddba_caseD_2:
            uVar22 = (uint)local_40.face;
          }
switchD_0022ddba_caseD_1:
          local_48 = uVar22;
          if ((uVar22 == 0) &&
             (size._0_2_ = pfrface[1].underline_position,
             size._2_2_ = pfrface[1].underline_thickness,
             local_48 = pfr_phy_font_load((PFR_PhyFont)&pfrface[1].size,stream,
                                          *(FT_UInt32 *)&pfrface[1].glyph,size), local_48 == 0)) {
            pfrface->face_index = (ulong)uVar25;
            uVar25 = *(uint *)&pfrface[2].generic.data;
            pFVar12 = (FT_Bitmap_Size *)pfrface->face_flags;
            iVar15 = 0;
            pfrface->num_glyphs = (ulong)uVar25 + 1;
            pfrface->face_flags = (ulong)pFVar12 | 1;
            uVar22 = 0;
            if ((ulong)uVar25 != 0) {
              piVar23 = (int *)(pfrface[2].bbox.xMin + 0xc);
              uVar19 = 0;
              do {
                uVar22 = uVar19;
                if (*piVar23 != 0) break;
                uVar19 = uVar19 + 1;
                piVar23 = piVar23 + 4;
                uVar22 = uVar25;
              } while (uVar25 != uVar19);
            }
            bVar7 = true;
            if (uVar22 == uVar25) {
              if (*(int *)&pfrface[2].style_name == 0) {
                local_48 = 3;
                iVar15 = 6;
                bVar7 = false;
              }
              else {
                pFVar12 = (FT_Bitmap_Size *)((ulong)pFVar12 & 0xfffffffffffffffe);
                pfrface->face_flags = (FT_Long)pFVar12;
              }
            }
            if (bVar7) {
              uVar25 = *(uint *)&pfrface[1].autohint.data;
              if ((uVar25 & 4) == 0) {
                *(byte *)&pfrface->face_flags = (byte)pfrface->face_flags | 4;
              }
              uVar14 = (ulong)((uVar25 & 1) << 4) + 0x10 | pfrface->face_flags;
              pfrface->face_flags = uVar14;
              uVar25 = *(uint *)&pfrface[2].style_name;
              new_count = (ulong)uVar25;
              if (new_count != 0) {
                pfrface->face_flags = uVar14 | 2;
              }
              if ((int)pfrface[2].bbox.yMin != 0) {
                *(byte *)&pfrface->face_flags = (byte)pfrface->face_flags | 0x40;
              }
              pFVar6 = (FT_String *)pfrface[2].num_glyphs;
              pfrface->family_name = pFVar6;
              if (pFVar6 == (FT_String *)0x0) {
                pfrface->family_name = (FT_String *)pfrface[2].style_flags;
              }
              uVar22 = *(uint *)&pfrface[1].driver;
              sVar3 = *(short *)&pfrface[1].sizes_list.tail;
              sVar4 = *(short *)&pfrface[1].stream;
              uVar8 = (uVar22 & 0xffff) * 0xc;
              uVar19 = (int)sVar3 - (int)sVar4;
              if ((int)uVar19 <= (int)(short)((ulong)uVar8 * 0x1999999a >> 0x20)) {
                uVar19 = uVar8 / 10;
              }
              pfrface->style_name = pfrface[2].family_name;
              pfrface->num_fixed_sizes = 0;
              pfrface->available_sizes = (FT_Bitmap_Size *)0x0;
              pFVar9 = pfrface[1].stream;
              (pfrface->bbox).xMin = (FT_Pos)pfrface[1].memory;
              (pfrface->bbox).yMin = (FT_Pos)pFVar9;
              pFVar10 = pfrface[1].sizes_list.tail;
              (pfrface->bbox).xMax = (FT_Pos)pfrface[1].sizes_list.head;
              (pfrface->bbox).yMax = (FT_Pos)pFVar10;
              pfrface->units_per_EM = (FT_UShort)uVar22;
              pfrface->ascender = sVar3;
              pfrface->descender = sVar4;
              pfrface->height = (FT_Short)uVar19;
              if (uVar25 != 0) {
                pFVar12 = (FT_Bitmap_Size *)
                          ft_mem_qrealloc(pfrface->stream->memory,0x20,0,new_count,(void *)0x0,
                                          (FT_Error *)&local_48);
                pfrface->available_sizes = pFVar12;
                iVar15 = 6;
                if (local_48 == 0) {
                  piVar23 = (int *)(*(long *)&pfrface[2].num_fixed_sizes + 4);
                  do {
                    iVar15 = *piVar23;
                    pFVar12->height = (FT_Short)iVar15;
                    iVar24 = piVar23[-1];
                    pFVar12->width = (FT_Short)iVar24;
                    uVar14 = (ulong)(uint)(iVar15 << 6);
                    pFVar12->size = uVar14;
                    pFVar12->x_ppem = (ulong)(uint)(iVar24 << 6);
                    pFVar12->y_ppem = uVar14;
                    pFVar12 = pFVar12 + 1;
                    piVar23 = piVar23 + 10;
                    uVar22 = (int)new_count - 1;
                    new_count = (ulong)uVar22;
                  } while (uVar22 != 0);
                  pfrface->num_fixed_sizes = uVar25;
                  iVar15 = 0;
                }
                if (local_48 != 0) goto LAB_0022dcb0;
              }
              if (((ulong)pfrface[1].autohint.data & 4) == 0) {
                uVar25 = (uint)*(ushort *)((long)&pfrface[1].autohint.data + 4);
              }
              else {
                iVar15 = *(int *)&pfrface[2].generic.data;
                uVar22 = 0;
                uVar25 = 0;
                if (iVar15 != 0) {
                  puVar21 = (uint *)(pfrface[2].bbox.xMin + 4);
                  do {
                    uVar25 = *puVar21;
                    if ((int)*puVar21 < (int)uVar22) {
                      uVar25 = uVar22;
                    }
                    uVar22 = uVar25;
                    puVar21 = puVar21 + 4;
                    iVar15 = iVar15 + -1;
                    uVar25 = uVar22;
                  } while (iVar15 != 0);
                }
              }
              pfrface->max_advance_width = (FT_Short)uVar25;
              pfrface->max_advance_height = pfrface->height;
              lVar16 = (ulong)pfrface->units_per_EM * -0x66666667;
              pfrface->underline_position =
                   (short)(uint)((ulong)lVar16 >> 0x22) - (short)(lVar16 >> 0x3f);
              pfrface->underline_thickness = pfrface->units_per_EM / 0x1e;
              local_40.encoding = FT_ENCODING_UNICODE;
              local_40.platform_id = 3;
              local_40.encoding_id = 1;
              iVar15 = 0;
              local_40.face = pfrface;
              local_48 = FT_CMap_New(&pfr_cmap_class_rec,(FT_Pointer)0x0,&local_40,
                                     (FT_CMap_conflict *)0x0);
              pFVar12 = (FT_Bitmap_Size *)(ulong)local_48;
              if ((int)pfrface[2].bbox.yMin != 0) {
                *(byte *)&pfrface->face_flags = (byte)pfrface->face_flags | 0x40;
              }
            }
LAB_0022dcb0:
            if ((iVar15 != 6) && (iVar15 != 0)) goto LAB_0022d78d;
          }
        }
        else {
          local_48 = 6;
        }
      }
    }
  }
  else {
    local_48 = 2;
  }
  pFVar12 = (FT_Bitmap_Size *)(ulong)local_48;
LAB_0022d78d:
  return (FT_Error)pFVar12;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pfr_face_init( FT_Stream      stream,
                 FT_Face        pfrface,
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    PFR_Face  face = (PFR_Face)pfrface;
    FT_Error  error;

    FT_UNUSED( num_params );
    FT_UNUSED( params );


    FT_TRACE2(( "PFR driver\n" ));

    /* load the header and check it */
    error = pfr_header_load( &face->header, stream );
    if ( error )
    {
      FT_TRACE2(( "  not a PFR font\n" ));
      error = FT_THROW( Unknown_File_Format );
      goto Exit;
    }

    if ( !pfr_header_check( &face->header ) )
    {
      FT_TRACE2(( "  not a PFR font\n" ));
      error = FT_THROW( Unknown_File_Format );
      goto Exit;
    }

    /* check face index */
    {
      FT_Long  num_faces;


      error = pfr_log_font_count( stream,
                                  face->header.log_dir_offset,
                                  &num_faces );
      if ( error )
        goto Exit;

      pfrface->num_faces = num_faces;
    }

    if ( face_index < 0 )
      goto Exit;

    if ( ( face_index & 0xFFFF ) >= pfrface->num_faces )
    {
      FT_ERROR(( "pfr_face_init: invalid face index\n" ));
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* load the face */
    error = pfr_log_font_load(
              &face->log_font,
              stream,
              (FT_UInt)( face_index & 0xFFFF ),
              face->header.log_dir_offset,
              FT_BOOL( face->header.phy_font_max_size_high ) );
    if ( error )
      goto Exit;

    /* load the physical font descriptor */
    error = pfr_phy_font_load( &face->phy_font, stream,
                               face->log_font.phys_offset,
                               face->log_font.phys_size );
    if ( error )
      goto Exit;

    /* set up all root face fields */
    {
      PFR_PhyFont  phy_font = &face->phy_font;


      pfrface->face_index = face_index & 0xFFFF;
      pfrface->num_glyphs = (FT_Long)phy_font->num_chars + 1;

      pfrface->face_flags |= FT_FACE_FLAG_SCALABLE;

      /* if gps_offset == 0 for all characters, we  */
      /* assume that the font only contains bitmaps */
      {
        FT_UInt  nn;


        for ( nn = 0; nn < phy_font->num_chars; nn++ )
          if ( phy_font->chars[nn].gps_offset != 0 )
            break;

        if ( nn == phy_font->num_chars )
        {
          if ( phy_font->num_strikes > 0 )
            pfrface->face_flags &= ~FT_FACE_FLAG_SCALABLE;
          else
          {
            FT_ERROR(( "pfr_face_init: font doesn't contain glyphs\n" ));
            error = FT_THROW( Invalid_File_Format );
            goto Exit;
          }
        }
      }

      if ( !( phy_font->flags & PFR_PHY_PROPORTIONAL ) )
        pfrface->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      if ( phy_font->flags & PFR_PHY_VERTICAL )
        pfrface->face_flags |= FT_FACE_FLAG_VERTICAL;
      else
        pfrface->face_flags |= FT_FACE_FLAG_HORIZONTAL;

      if ( phy_font->num_strikes > 0 )
        pfrface->face_flags |= FT_FACE_FLAG_FIXED_SIZES;

      if ( phy_font->num_kern_pairs > 0 )
        pfrface->face_flags |= FT_FACE_FLAG_KERNING;

      /* If no family name was found in the `undocumented' auxiliary
       * data, use the font ID instead.  This sucks but is better than
       * nothing.
       */
      pfrface->family_name = phy_font->family_name;
      if ( !pfrface->family_name )
        pfrface->family_name = phy_font->font_id;

      /* note that the style name can be NULL in certain PFR fonts,
       * probably meaning `Regular'
       */
      pfrface->style_name = phy_font->style_name;

      pfrface->num_fixed_sizes = 0;
      pfrface->available_sizes = NULL;

      pfrface->bbox         = phy_font->bbox;
      pfrface->units_per_EM = (FT_UShort)phy_font->outline_resolution;
      pfrface->ascender     = (FT_Short) phy_font->bbox.yMax;
      pfrface->descender    = (FT_Short) phy_font->bbox.yMin;

      pfrface->height = (FT_Short)( ( pfrface->units_per_EM * 12 ) / 10 );
      if ( pfrface->height < pfrface->ascender - pfrface->descender )
        pfrface->height = (FT_Short)( pfrface->ascender - pfrface->descender );

      if ( phy_font->num_strikes > 0 )
      {
        FT_UInt          n, count = phy_font->num_strikes;
        FT_Bitmap_Size*  size;
        PFR_Strike       strike;
        FT_Memory        memory = pfrface->stream->memory;


        if ( FT_QNEW_ARRAY( pfrface->available_sizes, count ) )
          goto Exit;

        size   = pfrface->available_sizes;
        strike = phy_font->strikes;
        for ( n = 0; n < count; n++, size++, strike++ )
        {
          size->height = (FT_Short)strike->y_ppm;
          size->width  = (FT_Short)strike->x_ppm;
          size->size   = (FT_Pos)( strike->y_ppm << 6 );
          size->x_ppem = (FT_Pos)( strike->x_ppm << 6 );
          size->y_ppem = (FT_Pos)( strike->y_ppm << 6 );
        }
        pfrface->num_fixed_sizes = (FT_Int)count;
      }

      /* now compute maximum advance width */
      if ( ( phy_font->flags & PFR_PHY_PROPORTIONAL ) == 0 )
        pfrface->max_advance_width = (FT_Short)phy_font->standard_advance;
      else
      {
        FT_Int    max = 0;
        FT_UInt   count = phy_font->num_chars;
        PFR_Char  gchar = phy_font->chars;


        for ( ; count > 0; count--, gchar++ )
        {
          if ( max < gchar->advance )
            max = gchar->advance;
        }

        pfrface->max_advance_width = (FT_Short)max;
      }

      pfrface->max_advance_height = pfrface->height;

      pfrface->underline_position  = (FT_Short)( -pfrface->units_per_EM / 10 );
      pfrface->underline_thickness = (FT_Short)(  pfrface->units_per_EM / 30 );

      /* create charmap */
      {
        FT_CharMapRec  charmap;


        charmap.face        = pfrface;
        charmap.platform_id = TT_PLATFORM_MICROSOFT;
        charmap.encoding_id = TT_MS_ID_UNICODE_CS;
        charmap.encoding    = FT_ENCODING_UNICODE;

        error = FT_CMap_New( &pfr_cmap_class_rec, NULL, &charmap, NULL );
      }

      /* check whether we have loaded any kerning pairs */
      if ( phy_font->num_kern_pairs )
        pfrface->face_flags |= FT_FACE_FLAG_KERNING;
    }

  Exit:
    return error;
  }